

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

PointerType * __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::GetPointer(PointerType *__return_storage_ptr__,
            GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            *this,SchemaType *schema)

{
  SchemaEntry *pSVar1;
  SchemaEntry *local_28;
  SchemaEntry *target;
  SchemaType *schema_local;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  
  local_28 = internal::Stack<rapidjson::CrtAllocator>::
             Bottom<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::SchemaEntry>
                       (&this->schemaMap_);
  while( true ) {
    pSVar1 = internal::Stack<rapidjson::CrtAllocator>::
             End<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::SchemaEntry>
                       (&this->schemaMap_);
    if (local_28 == pSVar1) {
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::GenericPointer(__return_storage_ptr__,(CrtAllocator *)0x0);
      return __return_storage_ptr__;
    }
    if (schema == local_28->schema) break;
    local_28 = local_28 + 1;
  }
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::GenericPointer(__return_storage_ptr__,&local_28->pointer);
  return __return_storage_ptr__;
}

Assistant:

PointerType GetPointer(const SchemaType* schema) const {
        for (const SchemaEntry* target = schemaMap_.template Bottom<SchemaEntry>(); target != schemaMap_.template End<SchemaEntry>(); ++target)
            if (schema == target->schema)
                return target->pointer;
        return PointerType();
    }